

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

int __thiscall QtMWidgets::Picker::findData(Picker *this,QVariant *data,int role,MatchFlags flags)

{
  PickerPrivate *pPVar1;
  QAbstractItemModel *pQVar2;
  iterator iVar3;
  int iVar4;
  QModelIndexList result;
  QModelIndex local_60;
  QModelIndex start;
  
  result.d.d = (Data *)0x0;
  result.d.ptr = (QModelIndex *)0x0;
  result.d.size = 0;
  pPVar1 = (this->d).d;
  pQVar2 = pPVar1->model;
  iVar4 = pPVar1->modelColumn;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&pPVar1->root);
  (**(code **)(*(long *)pQVar2 + 0x60))(&start,pQVar2,0,iVar4,&local_60);
  pQVar2 = ((this->d).d)->model;
  (**(code **)(*(long *)pQVar2 + 0x150))(&local_60,pQVar2,&start,role,data,1,flags.i);
  QArrayDataPointer<QModelIndex>::operator=(&result.d,(QArrayDataPointer<QModelIndex> *)&local_60);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&local_60);
  if (result.d.size == 0) {
    iVar4 = -1;
  }
  else {
    iVar3 = QList<QModelIndex>::begin(&result);
    iVar4 = (iVar3.i)->r;
  }
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&result.d);
  return iVar4;
}

Assistant:

int
Picker::findData( const QVariant & data, int role, Qt::MatchFlags flags ) const
{
	QModelIndexList result;

	QModelIndex start = d->model->index( 0, d->modelColumn, d->root );

	result = d->model->match( start, role, data, 1, flags );

	if( result.isEmpty() )
		return -1;

	return result.first().row();
}